

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-convert.cpp
# Opt level: O1

void test_convert<int,short>(uint length,int value)

{
  void *pvVar1;
  undefined8 *puVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  shared_ptr<int> pt;
  shared_ptr<short> pu;
  
  uVar4 = (long)(int)length * 4;
  if ((int)length < 0) {
    uVar4 = 0xffffffffffffffff;
  }
  uVar5 = (long)(int)length * 2;
  if ((int)length < 0) {
    uVar5 = 0xffffffffffffffff;
  }
  pvVar1 = operator_new__(uVar4);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<int*,void(*)(int*),std::allocator<void>,void>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pt,pvVar1,nosimd::common::free<int>);
  pt.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new__(uVar5);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<short*,void(*)(short*),std::allocator<void>,void>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pu,
             pt.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
             nosimd::common::free<short>);
  if (0 < (int)length) {
    uVar4 = 0;
    do {
      *(int *)((long)pvVar1 + uVar4 * 4) = value;
      uVar4 = uVar4 + 1;
    } while (length != uVar4);
    if (0 < (int)length) {
      uVar4 = 0;
      do {
        *(undefined2 *)
         ((long)&(pt.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                 _vptr__Sp_counted_base + uVar4 * 2) = *(undefined2 *)((long)pvVar1 + uVar4 * 4);
        uVar4 = uVar4 + 1;
      } while (length != uVar4);
    }
  }
  if (length != 0) {
    lVar3 = 0;
    do {
      if (*(short *)((long)&(pt.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                            _M_pi)->_vptr__Sp_counted_base + lVar3 * 2) != (short)value) {
        puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar2 = "void test_convert(unsigned int, _T) [_T = int, _U = short]";
        *(undefined4 *)(puVar2 + 1) = 0x17;
        *(uint *)((long)puVar2 + 0xc) = length;
        __cxa_throw(puVar2,&Exception::typeinfo,0);
      }
      lVar3 = lVar3 + 1;
    } while (length != (uint)lVar3);
  }
  if (pu.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               pu.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  if (pt.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               pt.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  return;
}

Assistant:

void test_convert(unsigned length, _T value)
{
    auto pt = std::shared_ptr<_T>(simd::malloc<_T>(length), simd::free<_T>);
    auto pu = std::shared_ptr<_U>(simd::malloc<_U>(length), simd::free<_U>);
    _T * t = pt.get();
    _U * u = pu.get();

    simd::set(value, t, length);
    simd::convert(t, u, length);

    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(u[i], (_U)value))
            FAIL();
    }
}